

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_acceptor.h
# Opt level: O3

int __thiscall
cppcms::impl::cgi::
socket_acceptor<cppcms::impl::cgi::fastcgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::fastcgi>_>
::accept(socket_acceptor<cppcms::impl::cgi::fastcgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::fastcgi>_>
         *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  fastcgi *__p;
  context *this_00;
  undefined4 in_register_00000034;
  long lVar1;
  shared_ptr<cppcms::impl::cgi::fastcgi> api;
  __shared_ptr<cppcms::impl::cgi::fastcgi,_(__gnu_cxx::_Lock_policy)2> local_38;
  shared_ptr<cppcms::impl::cgi::connection> local_28;
  
  lVar1 = CONCAT44(in_register_00000034,__fd);
  local_38._M_ptr = (element_type *)0x0;
  local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __p = server_api_factory<cppcms::impl::cgi::fastcgi>::operator()
                  ((server_api_factory<cppcms::impl::cgi::fastcgi> *)(lVar1 + 100),
                   *(service **)(lVar1 + 8));
  std::__shared_ptr<cppcms::impl::cgi::fastcgi,_(__gnu_cxx::_Lock_policy)2>::
  reset<cppcms::impl::cgi::fastcgi>(&local_38,__p);
  booster::aio::basic_io_device::assign((int)local_38._M_ptr + 0x100);
  if (*(char *)(lVar1 + 0x59) != '\0') {
    booster::aio::basic_socket::set_option(&(local_38._M_ptr)->socket_,0,1);
  }
  this_00 = (context *)operator_new(0x28);
  local_28.super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &(local_38._M_ptr)->super_connection;
  local_28.super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = local_38._M_refcount._M_pi;
  if (local_38._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_refcount._M_pi)->_M_use_count = (local_38._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_refcount._M_pi)->_M_use_count = (local_38._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  cppcms::http::context::context(this_00,&local_28);
  std::__shared_ptr<cppcms::http::context,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::http::context,void>
            ((__shared_ptr<cppcms::http::context,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  if (local_28.super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.
               super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_38._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_refcount._M_pi);
  }
  return (int)this;
}

Assistant:

virtual booster::shared_ptr< ::cppcms::http::context> accept(int fd)
			{
				booster::shared_ptr<ServerAPI> api;
				try {
					api.reset(factory_(srv_));
					api->socket_.assign(fd);
					fd=-1;
				}
				catch(...) {
					::close(fd);
					throw;
				}
				if(tcp_)
					api->socket_.set_option(io::basic_socket::tcp_no_delay,true);
				booster::shared_ptr< ::cppcms::http::context> cnt(new ::cppcms::http::context(api));
				return cnt;
			}